

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

FILE * open_file(char *name,char *mode)

{
  FILE *pFVar1;
  size_t sVar2;
  long lVar3;
  char testname [256];
  char acStack_128 [264];
  
  pFVar1 = fopen(name,mode);
  if (pFVar1 == (FILE *)0x0) {
    if (0 < incpathCount) {
      lVar3 = 0;
      do {
        if (incpath[str_offset[lVar3]] != '\0') {
          strcpy(acStack_128,incpath + str_offset[lVar3]);
          sVar2 = strlen(acStack_128);
          (acStack_128 + sVar2)[0] = '/';
          (acStack_128 + sVar2)[1] = '\0';
          strcat(acStack_128,name);
          pFVar1 = fopen(acStack_128,mode);
          if (pFVar1 != (FILE *)0x0) {
            return (FILE *)pFVar1;
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < incpathCount);
    }
    pFVar1 = (FILE *)0x0;
  }
  return (FILE *)pFVar1;
}

Assistant:

FILE *
open_file(char *name, char *mode)
{
	FILE 	*fileptr;
	char	testname[256];
	int	i;

	fileptr = fopen(name, mode);
	if (fileptr != NULL) return(fileptr);

	for (i = 0; i < incpathCount; ++i) {
		if (strlen(incpath+str_offset[i])) {
			strcpy(testname, incpath+str_offset[i]);
			strcat(testname, PATH_SEPARATOR_STRING);
			strcat(testname, name);
		
			fileptr = fopen(testname, mode);
			if (fileptr != NULL) break;
		}
	}

	return (fileptr);
}